

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::Environment::bind<tcu::Matrix<float,4,4>>
          (Environment *this,Variable<tcu::Matrix<float,_4,_4>_> *variable,IVal *value)

{
  void *__dest;
  SharedPtr<unsigned_char> local_50;
  key_type local_40;
  
  __dest = operator_new__(0x180);
  memcpy(__dest,value,0x180);
  std::__cxx11::string::string((string *)&local_40,(string *)&variable->m_name);
  de::SharedPtr<unsigned_char>::SharedPtr<de::ArrayDeleter<unsigned_char>>(&local_50,__dest);
  de::
  insert<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
            (&this->m_map,&local_40,&local_50);
  de::SharedPtr<unsigned_char>::release(&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void						bind	(const Variable<T>&					variable,
										 const typename Traits<T>::IVal&	value)
	{
		deUint8* const data = new deUint8[sizeof(value)];

		deMemcpy(data, &value, sizeof(value));
		de::insert(m_map, variable.getName(), SharedPtr<deUint8>(data, de::ArrayDeleter<deUint8>()));
	}